

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FboCases::SharedColorbufferTest::render
          (SharedColorbufferTest *this,Context *context,Surface *dst)

{
  undefined8 uVar1;
  deUint32 program;
  deUint32 dVar2;
  uint uVar3;
  uint uVar4;
  FboConfig *pFVar5;
  bool bVar6;
  Vector<float,_3> local_3fc;
  Vector<float,_3> local_3f0;
  Vector<float,_3> local_3e4;
  Vector<float,_3> local_3d8;
  Vector<float,_4> local_3cc;
  deUint32 local_3bc;
  undefined1 local_3b8 [4];
  deUint32 flatShaderID;
  FlatColorShader flatShader;
  Vector<float,_3> local_254;
  Vector<float,_3> local_248;
  Vector<float,_3> local_23c;
  Vector<float,_3> local_230;
  Vector<float,_3> local_224;
  undefined1 local_218 [8];
  Framebuffer fboB;
  FboConfig cfg;
  Framebuffer fboA;
  deUint32 metaballsTex;
  deUint32 quadsTex;
  bool stencil;
  int height;
  int width;
  undefined1 local_178 [4];
  deUint32 shaderID;
  SingleTex2DShader shader;
  Surface *dst_local;
  Context *context_local;
  SharedColorbufferTest *this_local;
  
  shader.super_ShaderProgram._336_8_ = dst;
  SingleTex2DShader::SingleTex2DShader((SingleTex2DShader *)local_178);
  program = (*context->_vptr_Context[0x75])(context,(SingleTex2DShader *)local_178);
  pFVar5 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  bVar6 = pFVar5->stencilbufferFormat != 0;
  createQuadsTex2D(context,1,0x1907,0x1401,0x40,0x40);
  createMetaballsTex2D(context,2,0x1908,0x1401,0x40,0x40);
  (*context->_vptr_Context[5])(context,0,0,0x80,0x80);
  SingleTex2DShader::setUnit((SingleTex2DShader *)local_178,context,program,0);
  pFVar5 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  Functional::Framebuffer::Framebuffer
            ((Framebuffer *)&cfg.stencilbufferType,context,pFVar5,0x80,0x80,0,0,0,0);
  Functional::Framebuffer::checkCompleteness((Framebuffer *)&cfg.stencilbufferType);
  pFVar5 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  cfg.depthbufferType = pFVar5->stencilbufferType;
  cfg.depthbufferFormat = pFVar5->stencilbufferFormat;
  cfg.colorbufferType = pFVar5->depthbufferType;
  cfg.colorbufferFormat = pFVar5->depthbufferFormat;
  fboB.m_depthbuffer = 0;
  fboB.m_stencilbuffer = 0;
  Functional::Framebuffer::Framebuffer
            ((Framebuffer *)local_218,context,(FboConfig *)&fboB.m_depthbuffer,0x80,0x80,0,0,0,0);
  dVar2 = Functional::Framebuffer::getFramebuffer((Framebuffer *)local_218);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)dVar2);
  pFVar5 = FboRenderCase::getConfig(&this->super_FboRenderCase);
  if (pFVar5->colorbufferType == 0xde1) {
    dVar2 = Functional::Framebuffer::getColorbuffer((Framebuffer *)&cfg.stencilbufferType);
    (*context->_vptr_Context[0x1e])(context,0x8d40,0x8ce0,0xde1,(ulong)dVar2,0);
  }
  else if (pFVar5->colorbufferType == 0x8d41) {
    dVar2 = Functional::Framebuffer::getColorbuffer((Framebuffer *)&cfg.stencilbufferType);
    (*context->_vptr_Context[0x20])(context,0x8d40,0x8ce0,0x8d41,(ulong)dVar2);
  }
  (*context->_vptr_Context[0x2d])(context,0x500);
  dVar2 = Functional::Framebuffer::getFramebuffer((Framebuffer *)&cfg.stencilbufferType);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)dVar2);
  (*context->_vptr_Context[6])(context,0xde1,1);
  (*context->_vptr_Context[0x2a])(0,0,0,0x3f800000);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  if (bVar6) {
    (*context->_vptr_Context[0x2c])(context,1);
    (*context->_vptr_Context[0x2d])(context,0x400);
  }
  (*context->_vptr_Context[0x33])(context,0xb71);
  tcu::Vector<float,_3>::Vector(&local_224,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_230,1.0,1.0,0.0);
  sglr::drawQuad(context,program,&local_224,&local_230);
  (*context->_vptr_Context[0x34])(context,0xb71);
  dVar2 = Functional::Framebuffer::getFramebuffer((Framebuffer *)local_218);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)dVar2);
  (*context->_vptr_Context[6])(context,0xde1,2);
  (*context->_vptr_Context[0x33])(context,0xbe2);
  (*context->_vptr_Context[0x42])(context,0x302,0x303,0,1);
  tcu::Vector<float,_3>::Vector(&local_23c,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_248,1.0,1.0,0.0);
  sglr::drawQuad(context,program,&local_23c,&local_248);
  (*context->_vptr_Context[6])(context,0xde1,1);
  (*context->_vptr_Context[0x33])(context,0xb71);
  tcu::Vector<float,_3>::Vector(&local_254,0.5,0.5,0.5);
  tcu::Vector<float,_3>::Vector
            ((Vector<float,_3> *)&flatShader.super_ShaderProgram.m_hasGeometryShader,1.0,1.0,0.5);
  sglr::drawQuad(context,program,&local_254,
                 (Vec3 *)&flatShader.super_ShaderProgram.m_hasGeometryShader);
  (*context->_vptr_Context[0x34])(context,0xb71);
  if (bVar6) {
    FlatColorShader::FlatColorShader((FlatColorShader *)local_3b8);
    dVar2 = (*context->_vptr_Context[0x75])(context,local_3b8);
    local_3bc = dVar2;
    tcu::Vector<float,_4>::Vector(&local_3cc,0.0,1.0,0.0,1.0);
    FlatColorShader::setColor((FlatColorShader *)local_3b8,context,dVar2,&local_3cc);
    (*context->_vptr_Context[0x33])(context,0xc11);
    (*context->_vptr_Context[0x32])(context,10,10,0xc,0x19);
    (*context->_vptr_Context[0x2c])(context,1);
    (*context->_vptr_Context[0x2d])(context,0x400);
    (*context->_vptr_Context[0x34])(context,0xc11);
    (*context->_vptr_Context[0x33])(context,0xb90);
    (*context->_vptr_Context[0x35])(context,0x202,1,0xff);
    dVar2 = local_3bc;
    tcu::Vector<float,_3>::Vector(&local_3d8,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_3e4,1.0,1.0,0.0);
    sglr::drawQuad(context,dVar2,&local_3d8,&local_3e4);
    (*context->_vptr_Context[0x34])(context,0xb90);
    FlatColorShader::~FlatColorShader((FlatColorShader *)local_3b8);
  }
  pFVar5 = Functional::Framebuffer::getConfig((Framebuffer *)&cfg.stencilbufferType);
  if (pFVar5->colorbufferType == 0xde1) {
    (*context->_vptr_Context[9])(context,0x8d40,0);
    dVar2 = Functional::Framebuffer::getColorbuffer((Framebuffer *)&cfg.stencilbufferType);
    (*context->_vptr_Context[6])(context,0xde1,(ulong)dVar2);
    uVar3 = (*context->_vptr_Context[2])();
    uVar4 = (*context->_vptr_Context[3])();
    (*context->_vptr_Context[5])(context,0,0,(ulong)uVar3,(ulong)uVar4);
    tcu::Vector<float,_3>::Vector(&local_3f0,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_3fc,1.0,1.0,0.0);
    sglr::drawQuad(context,program,&local_3f0,&local_3fc);
    uVar1 = shader.super_ShaderProgram._336_8_;
    uVar3 = (*context->_vptr_Context[2])();
    uVar4 = (*context->_vptr_Context[3])();
    (*context->_vptr_Context[0x80])(context,uVar1,0,0,(ulong)uVar3,(ulong)uVar4);
  }
  else {
    (*context->_vptr_Context[0x80])(context,shader.super_ShaderProgram._336_8_,0,0,0x80,0x80);
  }
  Functional::Framebuffer::~Framebuffer((Framebuffer *)local_218);
  Functional::Framebuffer::~Framebuffer((Framebuffer *)&cfg.stencilbufferType);
  SingleTex2DShader::~SingleTex2DShader((SingleTex2DShader *)local_178);
  return;
}

Assistant:

void SharedColorbufferTest::render (sglr::Context& context, Surface& dst)
{
	SingleTex2DShader	shader;
	deUint32			shaderID		= context.createProgram(&shader);
	int					width			= 128;
	int					height			= 128;
//	bool				depth			= getConfig().depthbufferFormat		!= GL_NONE;
	bool				stencil			= getConfig().stencilbufferFormat	!= GL_NONE;

	// Textures
	deUint32	quadsTex		= 1;
	deUint32	metaballsTex	= 2;
	createQuadsTex2D(context, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);
	createMetaballsTex2D(context, metaballsTex, GL_RGBA, GL_UNSIGNED_BYTE, 64, 64);

	context.viewport(0, 0, width, height);

	shader.setUnit(context, shaderID, 0);

	// Fbo A
	Framebuffer fboA(context, getConfig(), width, height);
	fboA.checkCompleteness();

	// Fbo B - don't create colorbuffer
	FboConfig cfg = getConfig();
	cfg.colorbufferType		= GL_NONE;
	cfg.colorbufferFormat	= GL_NONE;
	Framebuffer fboB(context, cfg, width, height);

	// Attach color buffer from fbo A
	context.bindFramebuffer(GL_FRAMEBUFFER, fboB.getFramebuffer());
	switch (getConfig().colorbufferType)
	{
		case GL_TEXTURE_2D:
			context.framebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, fboA.getColorbuffer(), 0);
			break;

		case GL_RENDERBUFFER:
			context.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, fboA.getColorbuffer());
			break;

		default:
			DE_ASSERT(false);
	}

	// Clear depth and stencil in fbo B
	context.clear(GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	// Render quads to fbo 1, with depth 0.0
	context.bindFramebuffer(GL_FRAMEBUFFER, fboA.getFramebuffer());
	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	context.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	if (stencil)
	{
		// Stencil to 1 in fbo A
		context.clearStencil(1);
		context.clear(GL_STENCIL_BUFFER_BIT);
	}

	context.enable(GL_DEPTH_TEST);
	sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
	context.disable(GL_DEPTH_TEST);

	// Blend metaballs to fbo 2
	context.bindFramebuffer(GL_FRAMEBUFFER, fboB.getFramebuffer());
	context.bindTexture(GL_TEXTURE_2D, metaballsTex);
	context.enable(GL_BLEND);
	context.blendFuncSeparate(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA, GL_ZERO, GL_ONE);
	sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	// Render small quad that is only visible if depth buffer is not shared with fbo A - or there is no depth bits
	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	context.enable(GL_DEPTH_TEST);
	sglr::drawQuad(context, shaderID, Vec3(0.5f, 0.5f, 0.5f), Vec3(1.0f, 1.0f, 0.5f));
	context.disable(GL_DEPTH_TEST);

	if (stencil)
	{
		FlatColorShader flatShader;
		deUint32		flatShaderID = context.createProgram(&flatShader);

		flatShader.setColor(context, flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		// Clear subset of stencil buffer to 1
		context.enable(GL_SCISSOR_TEST);
		context.scissor(10, 10, 12, 25);
		context.clearStencil(1);
		context.clear(GL_STENCIL_BUFFER_BIT);
		context.disable(GL_SCISSOR_TEST);

		// Render quad with stencil mask == 1
		context.enable(GL_STENCIL_TEST);
		context.stencilFunc(GL_EQUAL, 1, 0xffu);
		sglr::drawQuad(context, flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		context.disable(GL_STENCIL_TEST);
	}

	// Get results
	if (fboA.getConfig().colorbufferType == GL_TEXTURE_2D)
	{
		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.bindTexture(GL_TEXTURE_2D, fboA.getColorbuffer());
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
		context.readPixels(dst, 0, 0, width, height);
}